

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adversarialunions_benchmark.c
# Opt level: O1

int main(void)

{
  __time_t _Var1;
  int iVar2;
  roaring_bitmap_t **pprVar3;
  roaring_bitmap_t *prVar4;
  roaring_bitmap_t *x1;
  long lVar5;
  size_t i_1;
  size_t i_2;
  size_t i;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  timespec ts;
  timespec local_50;
  roaring_bitmap_t *local_40;
  roaring_bitmap_t *local_38;
  
  puts("How to best aggregate the bitmaps is data-sensitive.");
  puts("The naive approach works well when the bitmaps quickly become full");
  pprVar3 = (roaring_bitmap_t **)malloc(800);
  lVar6 = 0;
  do {
    prVar4 = roaring_bitmap_from_range(0,1000000,1);
    pprVar3[lVar6] = prVar4;
    lVar5 = 50000;
    do {
      prVar4 = pprVar3[lVar6];
      iVar2 = rand();
      roaring_bitmap_remove(prVar4,iVar2 + (int)((ulong)(long)iVar2 / 1000000) * -1000000);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    roaring_bitmap_run_optimize(pprVar3[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 100);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  local_40 = roaring_bitmap_or_many_heap(100,pprVar3);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar7._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar7._0_8_ = lVar6;
  auVar7._12_4_ = 0x45300000;
  printf("%f cycles per union (many heap) \n",
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  local_38 = roaring_bitmap_or_many(100,pprVar3);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar8._0_8_ = lVar6;
  auVar8._12_4_ = 0x45300000;
  printf("%f cycles per union (many) \n",
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  prVar4 = roaring_bitmap_copy(*pprVar3);
  lVar5 = 1;
  do {
    roaring_bitmap_or_inplace(prVar4,pprVar3[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 100);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = 0x45300000;
  printf("%f cycles per union (naive) \n",
         ((auVar9._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  lVar6 = 0;
  do {
    roaring_bitmap_free(pprVar3[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 100);
  free(pprVar3);
  roaring_bitmap_free(local_40);
  roaring_bitmap_free(local_38);
  roaring_bitmap_free(prVar4);
  puts("The naive approach works less well when the bitmaps do not quickly become full");
  pprVar3 = (roaring_bitmap_t **)malloc(800);
  lVar6 = 0;
  do {
    prVar4 = roaring_bitmap_from_range(0,1000000,100);
    pprVar3[lVar6] = prVar4;
    lVar5 = 50000;
    do {
      prVar4 = pprVar3[lVar6];
      iVar2 = rand();
      roaring_bitmap_remove(prVar4,iVar2 + (int)((ulong)(long)iVar2 / 1000000) * -1000000);
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    roaring_bitmap_run_optimize(pprVar3[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 100);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  local_40 = roaring_bitmap_or_many_heap(100,pprVar3);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar10._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar10._0_8_ = lVar6;
  auVar10._12_4_ = 0x45300000;
  printf("%f cycles per union (many heap) \n",
         ((auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  prVar4 = roaring_bitmap_or_many(100,pprVar3);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar11._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar11._0_8_ = lVar6;
  auVar11._12_4_ = 0x45300000;
  printf("%f cycles per union (many) \n",
         ((auVar11._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  clock_gettime(3,&local_50);
  lVar6 = local_50.tv_nsec;
  _Var1 = local_50.tv_sec;
  x1 = roaring_bitmap_copy(*pprVar3);
  lVar5 = 1;
  do {
    roaring_bitmap_or_inplace(x1,pprVar3[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 100);
  clock_gettime(3,&local_50);
  lVar6 = (local_50.tv_sec - _Var1) * 1000000000 + (local_50.tv_nsec - lVar6);
  auVar12._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar12._0_8_ = lVar6;
  auVar12._12_4_ = 0x45300000;
  printf("%f cycles per union (naive) \n",
         ((auVar12._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 100.0);
  lVar6 = 0;
  do {
    roaring_bitmap_free(pprVar3[lVar6]);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 100);
  free(pprVar3);
  roaring_bitmap_free(local_40);
  roaring_bitmap_free(prVar4);
  roaring_bitmap_free(x1);
  return 0;
}

Assistant:

int main() {
    printf("How to best aggregate the bitmaps is data-sensitive.\n");
    quickfull();
    notsofull();
    return 0;
}